

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpc.c
# Opt level: O1

mpc_parser_t * mpc_whitespaces(void)

{
  mpc_parser_t *pmVar1;
  mpc_parser_t *a;
  
  pmVar1 = mpc_oneof(" \f\n\r\t\v");
  pmVar1 = mpc_expect(pmVar1,"whitespace");
  a = (mpc_parser_t *)calloc(1,0x38);
  a->name = (char *)0x0;
  a->type = '\x14';
  a->retained = '\0';
  (a->data).repeat.x = pmVar1;
  (a->data).apply.f = mpcf_strfold;
  pmVar1 = mpc_expect(a,"spaces");
  return pmVar1;
}

Assistant:

mpc_parser_t *mpc_whitespaces(void) { return mpc_expect(mpc_many(mpcf_strfold, mpc_whitespace()), "spaces"); }